

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O0

void __thiscall
wasm::PrintExpressionContents::visitRethrow(PrintExpressionContents *this,Rethrow *curr)

{
  ostream *o;
  string_view local_28;
  Rethrow *local_18;
  Rethrow *curr_local;
  PrintExpressionContents *this_local;
  
  o = this->o;
  local_18 = curr;
  curr_local = (Rethrow *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_28,"rethrow ");
  printMedium(o,local_28);
  wasm::Name::print(&local_18->target,this->o);
  return;
}

Assistant:

void visitRethrow(Rethrow* curr) {
    printMedium(o, "rethrow ");
    curr->target.print(o);
  }